

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O0

bool boost::random::operator==
               (well_engine<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_boost::random::detail::M3<_16>,_boost::random::detail::M3<_15>,_boost::random::detail::M3<11>,_boost::random::detail::M0,_boost::random::detail::M3<_2>,_boost::random::detail::M3<_18>,_boost::random::detail::M2<_28>,_boost::random::detail::M5<_5,_3661901092U>,_boost::random::detail::no_tempering>
                *lhs,well_engine<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_boost::random::detail::M3<_16>,_boost::random::detail::M3<_15>,_boost::random::detail::M3<11>,_boost::random::detail::M0,_boost::random::detail::M3<_2>,_boost::random::detail::M3<_18>,_boost::random::detail::M2<_28>,_boost::random::detail::M5<_5,_3661901092U>,_boost::random::detail::no_tempering>
                     *rhs)

{
  uint uVar1;
  uint uVar2;
  size_t local_28;
  size_t i;
  well_engine<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_boost::random::detail::M3<_16>,_boost::random::detail::M3<_15>,_boost::random::detail::M3<11>,_boost::random::detail::M0,_boost::random::detail::M3<_2>,_boost::random::detail::M3<_18>,_boost::random::detail::M2<_28>,_boost::random::detail::M5<_5,_3661901092U>,_boost::random::detail::no_tempering>
  *rhs_local;
  well_engine<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_boost::random::detail::M3<_16>,_boost::random::detail::M3<_15>,_boost::random::detail::M3<11>,_boost::random::detail::M0,_boost::random::detail::M3<_2>,_boost::random::detail::M3<_18>,_boost::random::detail::M2<_28>,_boost::random::detail::M5<_5,_3661901092U>,_boost::random::detail::no_tempering>
  *lhs_local;
  
  local_28 = 0;
  while( true ) {
    if (local_28 == 0x10) {
      return true;
    }
    uVar1 = well_engine<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_boost::random::detail::M3<-16>,_boost::random::detail::M3<-15>,_boost::random::detail::M3<11>,_boost::random::detail::M0,_boost::random::detail::M3<-2>,_boost::random::detail::M3<-18>,_boost::random::detail::M2<-28>,_boost::random::detail::M5<-5,_3661901092U>,_boost::random::detail::no_tempering>
            ::compute(lhs,local_28);
    uVar2 = well_engine<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_boost::random::detail::M3<-16>,_boost::random::detail::M3<-15>,_boost::random::detail::M3<11>,_boost::random::detail::M0,_boost::random::detail::M3<-2>,_boost::random::detail::M3<-18>,_boost::random::detail::M2<-28>,_boost::random::detail::M5<-5,_3661901092U>,_boost::random::detail::no_tempering>
            ::compute(rhs,local_28);
    if (uVar1 != uVar2) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

friend bool operator==(const well_engine& lhs, const well_engine& rhs)
    {
        for (std::size_t i = 0; i != state_size; ++i)
            if (lhs.compute(i) != rhs.compute(i))
                return false;

        return true;
    }